

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O0

void __thiscall
helics::BinaryTranslatorOperation::BinaryTranslatorOperation(BinaryTranslatorOperation *this)

{
  TranslatorOperations *in_RDI;
  
  TranslatorOperations::TranslatorOperations(in_RDI);
  in_RDI->_vptr_TranslatorOperations = (_func_int **)&PTR__BinaryTranslatorOperation_00a413a0;
  std::make_shared<helics::BinaryTranslatorOperator>();
  return;
}

Assistant:

BinaryTranslatorOperation::BinaryTranslatorOperation():
    to(std::make_shared<BinaryTranslatorOperator>())
{
}